

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::Requantize_x86_avx512::forward
          (Requantize_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int *piVar2;
  long in_RCX;
  long *in_RDX;
  Mat *in_RSI;
  long in_RDI;
  bool bVar3;
  Mat scale_out_data_q;
  Mat bias_data_q;
  Mat scale_in_data_q;
  char *ptr_2;
  int *intptr_2;
  int q;
  Mat scale_out_data_i;
  Mat bias_data_i;
  Mat scale_in_data_i;
  char *ptr_1;
  int *intptr_1;
  int i_1;
  int size;
  char *ptr;
  int *intptr;
  int i;
  int ii;
  int nn_w;
  int wp;
  size_t out_elemsize;
  int elempack;
  int channels;
  int h;
  int w;
  int dims;
  Mat *m;
  Mat *m_1;
  undefined4 in_stack_fffffffffffff5a4;
  int in_stack_fffffffffffff5b0;
  int in_stack_fffffffffffff5b4;
  undefined4 in_stack_fffffffffffff5b8;
  int in_stack_fffffffffffff5bc;
  undefined4 in_stack_fffffffffffff5c0;
  int in_stack_fffffffffffff5c4;
  undefined8 in_stack_fffffffffffff5c8;
  void **ppvVar4;
  Mat *in_stack_fffffffffffff5d0;
  Allocator *in_stack_fffffffffffff630;
  void *local_8d8;
  int *local_8d0;
  long *local_8b8;
  void *local_890;
  int *local_888;
  undefined8 local_880;
  undefined4 local_878;
  long *local_870;
  undefined4 local_868;
  uint local_864;
  undefined4 local_860;
  undefined4 local_85c;
  undefined4 local_858;
  long local_850;
  void *local_848;
  int *local_840;
  undefined8 local_838;
  undefined4 local_830;
  long *local_828;
  undefined4 local_820;
  uint local_81c;
  undefined4 local_818;
  undefined4 local_814;
  undefined4 local_810;
  long local_808;
  undefined8 local_800;
  undefined8 local_7f8;
  undefined8 local_7f0;
  undefined4 local_7e8;
  long local_7e0;
  undefined4 local_7d8;
  undefined4 local_7d4;
  undefined4 local_7d0;
  undefined4 local_7cc;
  undefined4 local_7c8;
  undefined8 local_7c0;
  long local_7b8;
  undefined8 local_7b0;
  undefined8 local_7a8;
  undefined8 local_7a0;
  undefined4 local_798;
  Allocator *local_790;
  undefined4 local_788;
  undefined4 local_784;
  undefined4 local_780;
  undefined4 local_77c;
  undefined4 local_778;
  undefined8 local_770;
  void *local_768;
  int local_75c;
  void *local_758;
  int *local_750;
  undefined8 local_748;
  undefined4 local_740;
  long *local_738;
  undefined4 local_730;
  uint local_72c;
  undefined4 local_728;
  undefined4 local_724;
  undefined4 local_720;
  long local_718;
  void *local_700;
  int *local_6f8;
  undefined8 local_6f0;
  undefined4 local_6e8;
  long *local_6e0;
  undefined4 local_6d8;
  uint local_6d4;
  undefined4 local_6d0;
  undefined4 local_6cc;
  undefined4 local_6c8;
  long local_6c0;
  void *local_6b8;
  int *local_6b0;
  undefined8 local_6a8;
  undefined4 local_6a0;
  long *local_698;
  undefined4 local_690;
  uint local_68c;
  undefined4 local_688;
  undefined4 local_684;
  undefined4 local_680;
  long local_678;
  long local_670;
  void *local_668;
  int local_65c;
  int local_658;
  int local_654;
  long local_650;
  void *local_648;
  int local_640;
  int local_63c;
  int local_638;
  int local_634 [3];
  ulong local_628;
  uint local_61c;
  int local_618;
  int local_614;
  int local_610;
  int local_60c;
  long local_608;
  long *local_600;
  Mat *local_5f8;
  long *local_5e0;
  long *local_5d8;
  long *local_5d0;
  undefined8 *local_5c8;
  Mat *local_5c0;
  undefined8 *local_5b8;
  long *in_stack_fffffffffffffa50;
  undefined4 in_stack_fffffffffffffa58;
  int in_stack_fffffffffffffa5c;
  Mat *in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa68;
  int in_stack_fffffffffffffa6c;
  long *in_stack_fffffffffffffa70;
  uint in_stack_fffffffffffffa78;
  int in_stack_fffffffffffffa7c;
  
  local_60c = in_RSI->dims;
  local_610 = in_RSI->w;
  local_614 = in_RSI->h;
  local_618 = in_RSI->c;
  local_61c = in_RSI->elempack;
  local_628 = (ulong)local_61c;
  local_600 = in_RDX;
  local_5f8 = in_RSI;
  if (local_60c == 1) {
    local_608 = in_RCX;
    Mat::create(in_stack_fffffffffffff5d0,(int)((ulong)in_stack_fffffffffffff5c8 >> 0x20),
                CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                in_stack_fffffffffffff5bc,
                (Allocator *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
    local_5d0 = local_600;
    bVar3 = true;
    if (*local_600 != 0) {
      bVar3 = local_600[8] * (long)(int)local_600[7] == 0;
    }
    if (bVar3) {
      return -100;
    }
    local_634[1] = 1;
    local_634[0] = local_610 / *(int *)(local_608 + 4);
    piVar2 = std::max<int>(local_634 + 1,local_634);
    local_634[2] = *piVar2;
    local_638 = (local_610 + local_634[2] + -1) / local_634[2];
    for (local_63c = 0; local_63c < local_638; local_63c = local_63c + 1) {
      local_640 = local_63c * local_634[2];
      local_5c0 = local_5f8;
      local_648 = (void *)((long)local_5f8->data + (long)(int)(local_640 * local_61c) * 4);
      local_650 = *local_600 + (long)(int)(local_640 * local_61c);
      local_658 = local_610 - local_640;
      in_stack_fffffffffffffa50 = local_600;
      piVar2 = std::min<int>(&local_658,local_634 + 2);
      local_654 = *piVar2 * local_61c;
      requantize((int *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                 (char *)in_stack_fffffffffffffa70,
                 (Mat *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                 in_stack_fffffffffffffa60,
                 (Mat *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                 (int)((ulong)in_stack_fffffffffffffa50 >> 0x20),
                 (Mat *)CONCAT44(in_stack_fffffffffffff5a4,local_654),1,in_stack_fffffffffffff5b0);
    }
  }
  if (local_60c == 2) {
    Mat::create(in_stack_fffffffffffff5d0,(int)((ulong)in_stack_fffffffffffff5c8 >> 0x20),
                (int)in_stack_fffffffffffff5c8,
                CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                in_stack_fffffffffffff5bc,
                (Allocator *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
    local_5d8 = local_600;
    bVar3 = true;
    if (*local_600 != 0) {
      bVar3 = local_600[8] * (long)(int)local_600[7] == 0;
    }
    if (bVar3) {
      return -100;
    }
    for (local_65c = 0; local_65c < local_614; local_65c = local_65c + 1) {
      local_668 = (void *)((long)local_5f8->data +
                          (long)local_5f8->w * (long)local_65c * local_5f8->elemsize);
      local_670 = *local_600 +
                  (long)*(int *)((long)local_600 + 0x2c) * (long)local_65c * local_600[2];
      if (*(int *)(in_RDI + 0xd0) < 2) {
        local_6b8 = *(void **)(in_RDI + 0x128);
        local_6b0 = *(int **)(in_RDI + 0x130);
        local_6a8 = *(undefined8 *)(in_RDI + 0x138);
        local_6a0 = *(undefined4 *)(in_RDI + 0x140);
        local_698 = *(long **)(in_RDI + 0x148);
        local_690 = *(undefined4 *)(in_RDI + 0x150);
        local_68c = *(uint *)(in_RDI + 0x154);
        local_688 = *(undefined4 *)(in_RDI + 0x158);
        local_684 = *(undefined4 *)(in_RDI + 0x15c);
        local_680 = *(undefined4 *)(in_RDI + 0x160);
        local_678 = *(long *)(in_RDI + 0x168);
        if (local_6b0 != (int *)0x0) {
          LOCK();
          *local_6b0 = *local_6b0 + 1;
          UNLOCK();
        }
      }
      else {
        local_6b8 = (void *)(*(long *)(in_RDI + 0x128) +
                            (long)(int)(local_65c * local_61c) * *(long *)(in_RDI + 0x138));
        local_6a8 = *(undefined8 *)(in_RDI + 0x138);
        local_6a0 = *(undefined4 *)(in_RDI + 0x140);
        local_698 = *(long **)(in_RDI + 0x148);
        local_6b0 = (int *)0x0;
        local_690 = 1;
        local_68c = local_61c;
        local_688 = 1;
        local_684 = 1;
        local_680 = 1;
        local_678 = (long)(int)local_61c;
      }
      if (*(int *)(in_RDI + 0xd8) < 2) {
        local_700 = *(void **)(in_RDI + 0x1b8);
        local_6f8 = *(int **)(in_RDI + 0x1c0);
        local_6f0 = *(undefined8 *)(in_RDI + 0x1c8);
        local_6e8 = *(undefined4 *)(in_RDI + 0x1d0);
        local_6e0 = *(long **)(in_RDI + 0x1d8);
        local_6d8 = *(undefined4 *)(in_RDI + 0x1e0);
        local_6d4 = *(uint *)(in_RDI + 0x1e4);
        local_6d0 = *(undefined4 *)(in_RDI + 0x1e8);
        local_6cc = *(undefined4 *)(in_RDI + 0x1ec);
        local_6c8 = *(undefined4 *)(in_RDI + 0x1f0);
        local_6c0 = *(long *)(in_RDI + 0x1f8);
        if (local_6f8 != (int *)0x0) {
          LOCK();
          *local_6f8 = *local_6f8 + 1;
          UNLOCK();
        }
      }
      else {
        local_700 = (void *)(*(long *)(in_RDI + 0x1b8) +
                            (long)(int)(local_65c * local_61c) * *(long *)(in_RDI + 0x1c8));
        local_6f0 = *(undefined8 *)(in_RDI + 0x1c8);
        local_6e8 = *(undefined4 *)(in_RDI + 0x1d0);
        local_6e0 = *(long **)(in_RDI + 0x1d8);
        local_6f8 = (int *)0x0;
        local_6d8 = 1;
        local_6d4 = local_61c;
        local_6d0 = 1;
        local_6cc = 1;
        local_6c8 = 1;
        local_6c0 = (long)(int)local_61c;
      }
      if (*(int *)(in_RDI + 0xd4) < 2) {
        local_758 = *(void **)(in_RDI + 0x170);
        local_750 = *(int **)(in_RDI + 0x178);
        local_748 = *(undefined8 *)(in_RDI + 0x180);
        local_740 = *(undefined4 *)(in_RDI + 0x188);
        local_738 = *(long **)(in_RDI + 400);
        local_730 = *(undefined4 *)(in_RDI + 0x198);
        local_72c = *(uint *)(in_RDI + 0x19c);
        local_728 = *(undefined4 *)(in_RDI + 0x1a0);
        local_724 = *(undefined4 *)(in_RDI + 0x1a4);
        local_720 = *(undefined4 *)(in_RDI + 0x1a8);
        local_718 = *(long *)(in_RDI + 0x1b0);
        if (local_750 != (int *)0x0) {
          LOCK();
          *local_750 = *local_750 + 1;
          UNLOCK();
        }
      }
      else {
        local_758 = (void *)(*(long *)(in_RDI + 0x170) +
                            (long)(int)(local_65c * local_61c) * *(long *)(in_RDI + 0x180));
        local_748 = *(undefined8 *)(in_RDI + 0x180);
        local_740 = *(undefined4 *)(in_RDI + 0x188);
        local_738 = *(long **)(in_RDI + 400);
        local_750 = (int *)0x0;
        local_730 = 1;
        local_72c = local_61c;
        local_728 = 1;
        local_724 = 1;
        local_720 = 1;
        local_718 = (long)(int)local_61c;
      }
      in_stack_fffffffffffffa5c = local_65c;
      in_stack_fffffffffffffa60 = local_5f8;
      in_stack_fffffffffffffa6c = local_65c;
      in_stack_fffffffffffffa70 = local_600;
      requantize((int *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                 (char *)local_600,(Mat *)CONCAT44(local_65c,in_stack_fffffffffffffa68),local_5f8,
                 (Mat *)CONCAT44(local_65c,in_stack_fffffffffffffa58),
                 (int)((ulong)in_stack_fffffffffffffa50 >> 0x20),
                 (Mat *)CONCAT44(in_stack_fffffffffffff5a4,local_610),local_61c,
                 in_stack_fffffffffffff5b0);
      if (local_750 != (int *)0x0) {
        LOCK();
        iVar1 = *local_750;
        *local_750 = *local_750 + -1;
        UNLOCK();
        if (iVar1 == 1) {
          if (local_738 == (long *)0x0) {
            if (local_758 != (void *)0x0) {
              free(local_758);
            }
          }
          else {
            (**(code **)(*local_738 + 0x18))(local_738,local_758);
          }
        }
      }
      local_758 = (void *)0x0;
      local_748 = 0;
      local_740 = 0;
      local_730 = 0;
      local_72c = 0;
      local_728 = 0;
      local_724 = 0;
      local_720 = 0;
      local_718 = 0;
      local_750 = (int *)0x0;
      if (local_6f8 != (int *)0x0) {
        LOCK();
        iVar1 = *local_6f8;
        *local_6f8 = *local_6f8 + -1;
        UNLOCK();
        if (iVar1 == 1) {
          if (local_6e0 == (long *)0x0) {
            if (local_700 != (void *)0x0) {
              free(local_700);
            }
          }
          else {
            (**(code **)(*local_6e0 + 0x18))(local_6e0,local_700);
          }
        }
      }
      local_700 = (void *)0x0;
      local_6f0 = 0;
      local_6e8 = 0;
      local_6d8 = 0;
      local_6d4 = 0;
      local_6d0 = 0;
      local_6cc = 0;
      local_6c8 = 0;
      local_6c0 = 0;
      local_6f8 = (int *)0x0;
      if (local_6b0 != (int *)0x0) {
        LOCK();
        iVar1 = *local_6b0;
        *local_6b0 = *local_6b0 + -1;
        UNLOCK();
        if (iVar1 == 1) {
          if (local_698 == (long *)0x0) {
            if (local_6b8 != (void *)0x0) {
              free(local_6b8);
            }
          }
          else {
            (**(code **)(*local_698 + 0x18))(local_698,local_6b8);
          }
        }
      }
      local_6b8 = (void *)0x0;
      local_6a8 = 0;
      local_6a0 = 0;
      local_690 = 0;
      local_68c = 0;
      local_688 = 0;
      local_684 = 0;
      local_680 = 0;
      local_678 = 0;
      local_6b0 = (int *)0x0;
    }
  }
  if (local_60c == 3) {
    Mat::create(in_stack_fffffffffffff5d0,(int)((ulong)in_stack_fffffffffffff5c8 >> 0x20),
                (int)in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c4,
                CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                in_stack_fffffffffffff5b4,in_stack_fffffffffffff630);
    local_5e0 = local_600;
    bVar3 = true;
    if (*local_600 != 0) {
      bVar3 = local_600[8] * (long)(int)local_600[7] == 0;
    }
    if (bVar3) {
      return -100;
    }
    for (local_75c = 0; local_75c < local_618; local_75c = local_75c + 1) {
      local_768 = (void *)((long)local_5f8->data +
                          local_5f8->cstep * (long)local_75c * local_5f8->elemsize);
      local_790 = local_5f8->allocator;
      local_5c8 = &local_7b0;
      local_7b8 = *local_600 + local_600[8] * (long)local_75c * local_600[2];
      local_7e0 = local_600[4];
      local_5b8 = &local_800;
      local_778 = 0;
      local_77c = 0;
      local_780 = 0;
      local_784 = 0;
      local_798 = 0;
      local_7a0 = 0;
      local_7a8 = 0;
      local_7b0 = 0;
      local_770 = 0;
      local_788 = 0;
      local_800 = 0;
      local_7f0 = 0;
      local_7e8 = 0;
      local_7d8 = 0;
      local_7d4 = 0;
      local_7d0 = 0;
      local_7cc = 0;
      local_7c8 = 0;
      local_7c0 = 0;
      local_7f8 = 0;
      if (*(int *)(in_RDI + 0xd0) < 2) {
        local_848 = *(void **)(in_RDI + 0x128);
        local_840 = *(int **)(in_RDI + 0x130);
        local_838 = *(undefined8 *)(in_RDI + 0x138);
        local_830 = *(undefined4 *)(in_RDI + 0x140);
        local_828 = *(long **)(in_RDI + 0x148);
        local_820 = *(undefined4 *)(in_RDI + 0x150);
        local_81c = *(uint *)(in_RDI + 0x154);
        local_818 = *(undefined4 *)(in_RDI + 0x158);
        local_814 = *(undefined4 *)(in_RDI + 0x15c);
        local_810 = *(undefined4 *)(in_RDI + 0x160);
        local_808 = *(long *)(in_RDI + 0x168);
        if (local_840 != (int *)0x0) {
          LOCK();
          *local_840 = *local_840 + 1;
          UNLOCK();
        }
      }
      else {
        local_848 = (void *)(*(long *)(in_RDI + 0x128) +
                            (long)(int)(local_75c * local_61c) * *(long *)(in_RDI + 0x138));
        local_838 = *(undefined8 *)(in_RDI + 0x138);
        local_830 = *(undefined4 *)(in_RDI + 0x140);
        local_828 = *(long **)(in_RDI + 0x148);
        local_840 = (int *)0x0;
        local_820 = 1;
        local_81c = local_61c;
        local_818 = 1;
        local_814 = 1;
        local_810 = 1;
        local_808 = (long)(int)local_61c;
      }
      if (*(int *)(in_RDI + 0xd8) < 2) {
        local_890 = *(void **)(in_RDI + 0x1b8);
        local_888 = *(int **)(in_RDI + 0x1c0);
        local_880 = *(undefined8 *)(in_RDI + 0x1c8);
        local_878 = *(undefined4 *)(in_RDI + 0x1d0);
        local_870 = *(long **)(in_RDI + 0x1d8);
        local_868 = *(undefined4 *)(in_RDI + 0x1e0);
        local_864 = *(uint *)(in_RDI + 0x1e4);
        local_860 = *(undefined4 *)(in_RDI + 0x1e8);
        local_85c = *(undefined4 *)(in_RDI + 0x1ec);
        local_858 = *(undefined4 *)(in_RDI + 0x1f0);
        local_850 = *(long *)(in_RDI + 0x1f8);
        if (local_888 != (int *)0x0) {
          LOCK();
          *local_888 = *local_888 + 1;
          UNLOCK();
        }
      }
      else {
        local_890 = (void *)(*(long *)(in_RDI + 0x1b8) +
                            (long)(int)(local_75c * local_61c) * *(long *)(in_RDI + 0x1c8));
        local_880 = *(undefined8 *)(in_RDI + 0x1c8);
        local_878 = *(undefined4 *)(in_RDI + 0x1d0);
        local_870 = *(long **)(in_RDI + 0x1d8);
        local_888 = (int *)0x0;
        local_868 = 1;
        local_864 = local_61c;
        local_860 = 1;
        local_85c = 1;
        local_858 = 1;
        local_850 = (long)(int)local_61c;
      }
      if (*(int *)(in_RDI + 0xd4) < 2) {
        local_8d8 = *(void **)(in_RDI + 0x170);
        local_8d0 = *(int **)(in_RDI + 0x178);
        local_8b8 = *(long **)(in_RDI + 400);
        if (local_8d0 != (int *)0x0) {
          LOCK();
          *local_8d0 = *local_8d0 + 1;
          UNLOCK();
        }
      }
      else {
        in_stack_fffffffffffffa7c = local_75c * local_61c;
        local_8d8 = (void *)(*(long *)(in_RDI + 0x170) +
                            (long)in_stack_fffffffffffffa7c * *(long *)(in_RDI + 0x180));
        local_8b8 = *(long **)(in_RDI + 400);
        local_8d0 = (int *)0x0;
        in_stack_fffffffffffffa78 = local_61c;
      }
      requantize((int *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                 (char *)in_stack_fffffffffffffa70,
                 (Mat *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                 in_stack_fffffffffffffa60,
                 (Mat *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                 (int)((ulong)in_stack_fffffffffffffa50 >> 0x20),
                 (Mat *)CONCAT44(in_stack_fffffffffffff5a4,local_610 * local_614),local_61c,
                 in_stack_fffffffffffff5b0);
      if (local_8d0 != (int *)0x0) {
        LOCK();
        iVar1 = *local_8d0;
        *local_8d0 = *local_8d0 + -1;
        UNLOCK();
        if (iVar1 == 1) {
          if (local_8b8 == (long *)0x0) {
            if (local_8d8 != (void *)0x0) {
              free(local_8d8);
            }
          }
          else {
            (**(code **)(*local_8b8 + 0x18))(local_8b8,local_8d8);
          }
        }
      }
      ppvVar4 = &local_890;
      if (local_888 != (int *)0x0) {
        LOCK();
        iVar1 = *local_888;
        *local_888 = *local_888 + -1;
        UNLOCK();
        if (iVar1 == 1) {
          if (local_870 == (long *)0x0) {
            if (local_890 != (void *)0x0) {
              free(local_890);
            }
          }
          else {
            (**(code **)(*local_870 + 0x18))(local_870,local_890);
          }
        }
      }
      *ppvVar4 = (void *)0x0;
      ppvVar4[2] = (void *)0x0;
      *(undefined4 *)(ppvVar4 + 3) = 0;
      *(undefined4 *)(ppvVar4 + 5) = 0;
      *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
      *(undefined4 *)(ppvVar4 + 6) = 0;
      *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
      *(undefined4 *)(ppvVar4 + 7) = 0;
      ppvVar4[8] = (void *)0x0;
      ppvVar4[1] = (void *)0x0;
      ppvVar4 = &local_848;
      if (local_840 != (int *)0x0) {
        LOCK();
        iVar1 = *local_840;
        *local_840 = *local_840 + -1;
        UNLOCK();
        if (iVar1 == 1) {
          if (local_828 == (long *)0x0) {
            if (local_848 != (void *)0x0) {
              free(local_848);
            }
          }
          else {
            (**(code **)(*local_828 + 0x18))(local_828,local_848);
          }
        }
      }
      *ppvVar4 = (void *)0x0;
      ppvVar4[2] = (void *)0x0;
      *(undefined4 *)(ppvVar4 + 3) = 0;
      *(undefined4 *)(ppvVar4 + 5) = 0;
      *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
      *(undefined4 *)(ppvVar4 + 6) = 0;
      *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
      *(undefined4 *)(ppvVar4 + 7) = 0;
      ppvVar4[8] = (void *)0x0;
      ppvVar4[1] = (void *)0x0;
    }
  }
  return 0;
}

Assistant:

int Requantize_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;
    const size_t out_elemsize = elempack * 1u;

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int wp = std::max(1, w / opt.num_threads);
        const int nn_w = (w + wp - 1) / wp;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_w; ii++)
        {
            const int i = ii * wp;

            const int* intptr = (const int*)bottom_blob + i * elempack;
            signed char* ptr = (signed char*)top_blob + i * elempack;

            // assert scale_in_data_size == 1
            // assert bias_data_size == 0 || bias_data_size == 1
            // assert scale_out_data_size == 1

            const int size = std::min(w - i, wp) * elempack;

            requantize(intptr, ptr, scale_in_data, bias_data, scale_out_data, activation_type, activation_params, size, 1);
        }
    }

    if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            const int* intptr = bottom_blob.row<const int>(i);
            signed char* ptr = top_blob.row<signed char>(i);

            const Mat scale_in_data_i = scale_in_data_size > 1 ? scale_in_data.range(i * elempack, elempack) : scale_in_data;
            const Mat bias_data_i = bias_data_size > 1 ? bias_data.range(i * elempack, elempack) : bias_data;
            const Mat scale_out_data_i = scale_out_data_size > 1 ? scale_out_data.range(i * elempack, elempack) : scale_out_data;

            requantize(intptr, ptr, scale_in_data_i, bias_data_i, scale_out_data_i, activation_type, activation_params, w, elempack);
        }
    }

    if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const int* intptr = bottom_blob.channel(q);
            signed char* ptr = top_blob.channel(q);

            const Mat scale_in_data_q = scale_in_data_size > 1 ? scale_in_data.range(q * elempack, elempack) : scale_in_data;
            const Mat bias_data_q = bias_data_size > 1 ? bias_data.range(q * elempack, elempack) : bias_data;
            const Mat scale_out_data_q = scale_out_data_size > 1 ? scale_out_data.range(q * elempack, elempack) : scale_out_data;

            requantize(intptr, ptr, scale_in_data_q, bias_data_q, scale_out_data_q, activation_type, activation_params, w * h, elempack);
        }
    }

    return 0;
}